

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.h
# Opt level: O2

void __thiscall chrono::viper::ViperPart::~ViperPart(ViperPart *this)

{
  this->_vptr_ViperPart = (_func_int **)&PTR__ViperPart_001a0f10;
  std::__cxx11::string::~string((string *)&this->m_mesh_name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~ViperPart() {}